

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

void roaring_bitmap_statistics(roaring_bitmap_t *r,roaring_statistics_t *stat)

{
  uint8_t uVar1;
  int iVar2;
  int32_t iVar3;
  uint64_t uVar4;
  uint32_t sbytes;
  uint32_t card;
  uint32_t uStack_30;
  uint8_t truetype;
  int i;
  min_max_sum_t mms;
  roaring_array_t *ra;
  roaring_statistics_t *stat_local;
  roaring_bitmap_t *r_local;
  
  mms.sum = (uint64_t)r;
  memset(stat,0,0x40);
  stat->n_containers = *(uint32_t *)mms.sum;
  uVar4 = roaring_bitmap_get_cardinality(r);
  stat->cardinality = uVar4;
  uStack_30 = 0xffffffff;
  i = 0;
  mms.min = 0;
  mms.max = 0;
  roaring_iterate(r,min_max_sum_fnc,&stack0xffffffffffffffd0);
  stat->min_value = uStack_30;
  stat->max_value = i;
  stat->sum_value = mms._0_8_;
  card = 0;
  do {
    if (*(int *)mms.sum <= (int)card) {
      return;
    }
    uVar1 = get_container_type(*(container_t **)(*(long *)(mms.sum + 8) + (long)(int)card * 8),
                               *(uint8_t *)(*(long *)(mms.sum + 0x18) + (long)(int)card));
    iVar2 = container_get_cardinality
                      (*(container_t **)(*(long *)(mms.sum + 8) + (long)(int)card * 8),
                       *(uint8_t *)(*(long *)(mms.sum + 0x18) + (long)(int)card));
    iVar3 = container_size_in_bytes
                      (*(container_t **)(*(long *)(mms.sum + 8) + (long)(int)card * 8),
                       *(uint8_t *)(*(long *)(mms.sum + 0x18) + (long)(int)card));
    if (uVar1 == '\x01') {
      stat->n_bitset_containers = stat->n_bitset_containers + 1;
      stat->n_values_bitset_containers = iVar2 + stat->n_values_bitset_containers;
      stat->n_bytes_bitset_containers = iVar3 + stat->n_bytes_bitset_containers;
    }
    else if (uVar1 == '\x02') {
      stat->n_array_containers = stat->n_array_containers + 1;
      stat->n_values_array_containers = iVar2 + stat->n_values_array_containers;
      stat->n_bytes_array_containers = iVar3 + stat->n_bytes_array_containers;
    }
    else {
      if (uVar1 != '\x03') {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                      ,0x3be7,
                      "void roaring_bitmap_statistics(const roaring_bitmap_t *, roaring_statistics_t *)"
                     );
      }
      stat->n_run_containers = stat->n_run_containers + 1;
      stat->n_values_run_containers = iVar2 + stat->n_values_run_containers;
      stat->n_bytes_run_containers = iVar3 + stat->n_bytes_run_containers;
    }
    card = card + 1;
  } while( true );
}

Assistant:

void roaring_bitmap_statistics(const roaring_bitmap_t *r,
                               roaring_statistics_t *stat) {
    const roaring_array_t *ra = &r->high_low_container;

    memset(stat, 0, sizeof(*stat));
    stat->n_containers = ra->size;
    stat->cardinality = roaring_bitmap_get_cardinality(r);
    min_max_sum_t mms;
    mms.min = UINT32_C(0xFFFFFFFF);
    mms.max = UINT32_C(0);
    mms.sum = 0;
    roaring_iterate(r, &min_max_sum_fnc, &mms);
    stat->min_value = mms.min;
    stat->max_value = mms.max;
    stat->sum_value = mms.sum;

    for (int i = 0; i < ra->size; ++i) {
        uint8_t truetype =
            get_container_type(ra->containers[i], ra->typecodes[i]);
        uint32_t card =
            container_get_cardinality(ra->containers[i], ra->typecodes[i]);
        uint32_t sbytes =
            container_size_in_bytes(ra->containers[i], ra->typecodes[i]);
        switch (truetype) {
            case BITSET_CONTAINER_TYPE:
                stat->n_bitset_containers++;
                stat->n_values_bitset_containers += card;
                stat->n_bytes_bitset_containers += sbytes;
                break;
            case ARRAY_CONTAINER_TYPE:
                stat->n_array_containers++;
                stat->n_values_array_containers += card;
                stat->n_bytes_array_containers += sbytes;
                break;
            case RUN_CONTAINER_TYPE:
                stat->n_run_containers++;
                stat->n_values_run_containers += card;
                stat->n_bytes_run_containers += sbytes;
                break;
            default:
                assert(false);
                __builtin_unreachable();
        }
    }
}